

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(long array,int size)

{
  undefined8 uVar1;
  bool bVar2;
  Option *tmp;
  int best_i;
  int j;
  int i;
  int size_local;
  Option **array_local;
  
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    tmp._0_4_ = best_i;
    tmp._4_4_ = best_i;
    while (tmp._4_4_ = tmp._4_4_ + 1, tmp._4_4_ < size) {
      bVar2 = Option::OptionLt::operator()
                        ((OptionLt *)((long)&array_local + 7),
                         *(Option **)(array + (long)tmp._4_4_ * 8),
                         *(Option **)(array + (long)(int)tmp * 8));
      if (bVar2) {
        tmp._0_4_ = tmp._4_4_;
      }
    }
    uVar1 = *(undefined8 *)(array + (long)best_i * 8);
    *(undefined8 *)(array + (long)best_i * 8) = *(undefined8 *)(array + (long)(int)tmp * 8);
    *(undefined8 *)(array + (long)(int)tmp * 8) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}